

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.h
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::ConvertToNinjaAbsPath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *path)

{
  cmGlobalNinjaGenerator *this_00;
  string local_40;
  string *local_20;
  string *path_local;
  cmNinjaTargetGenerator *this_local;
  
  local_20 = path;
  path_local = (string *)this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  this_00 = GetGlobalGenerator(this);
  std::__cxx11::string::string((string *)&local_40,(string *)path);
  cmGlobalNinjaGenerator::ConvertToNinjaAbsPath(__return_storage_ptr__,this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ConvertToNinjaAbsPath(std::string path) const
  {
    return this->GetGlobalGenerator()->ConvertToNinjaAbsPath(std::move(path));
  }